

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day04a.cpp
# Opt level: O0

int day4a::sum_of_real_rooms(string *input)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  allocator<char> local_291;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  string local_270;
  allocator<char> local_249;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  undefined1 local_228 [8];
  string checksum;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  undefined1 local_1e8 [8];
  string name;
  int local_1b4;
  string local_1b0 [4];
  int sum;
  string line;
  istringstream stream;
  string *input_local;
  
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(line.field_2._M_local_buf + 8),(string *)input,_S_in);
  std::__cxx11::string::string(local_1b0);
  local_1b4 = 0;
  while( true ) {
    piVar3 = std::operator>>((istream *)(line.field_2._M_local_buf + 8),local_1b0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    local_1f0._M_current = (char *)std::__cxx11::string::begin();
    local_200._M_current = (char *)std::__cxx11::string::end();
    local_1f8 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator-(&local_200,0xb);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)local_1e8,local_1f0,local_1f8,
               (allocator<char> *)(checksum.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(checksum.field_2._M_local_buf + 0xf));
    local_238._M_current = (char *)std::__cxx11::string::end();
    local_230 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator-(&local_238,6);
    local_248._M_current = (char *)std::__cxx11::string::end();
    local_240 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator-(&local_248,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)local_228,local_230,local_240,&local_249);
    std::allocator<char>::~allocator(&local_249);
    bVar1 = is_real_room((string *)local_1e8,(string *)local_228);
    if (bVar1) {
      local_280._M_current = (char *)std::__cxx11::string::end();
      local_278 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator-(&local_280,10);
      local_290._M_current = (char *)std::__cxx11::string::end();
      local_288 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator-(&local_290,7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((string *)&local_270,local_278,local_288,&local_291);
      iVar2 = std::__cxx11::stoi(&local_270,(size_t *)0x0,10);
      local_1b4 = iVar2 + local_1b4;
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_291);
    }
    std::__cxx11::string::~string((string *)local_228);
    std::__cxx11::string::~string((string *)local_1e8);
  }
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
  return local_1b4;
}

Assistant:

int sum_of_real_rooms(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		int sum = 0;
		while(stream >> line) {
			std::string name{line.begin(), line.end() - 11};
			std::string checksum{line.end() - 6, line.end() - 1};
			if(is_real_room(name, checksum)) {
				sum += std::stoi(std::string{line.end() - 10, line.end() - 7});
			}
		}
		return sum;
	}